

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O3

void __thiscall DBaseDecal::Serialize(DBaseDecal *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  DObject *v;
  DBaseDecal *local_20;
  
  DObject::Serialize((DObject *)this,arc);
  local_20 = this->WallPrev;
  ::Serialize(arc,"wallprev",(DObject **)&local_20,(DObject **)0x0,(bool *)0x0);
  this->WallPrev = local_20;
  local_20 = this->WallNext;
  ::Serialize(arc,"wallnext",(DObject **)&local_20,(DObject **)0x0,(bool *)0x0);
  this->WallNext = local_20;
  pFVar1 = ::Serialize(arc,"leftdistance",&this->LeftDistance,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"z",&this->Z,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"scalex",&this->ScaleX,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"scaley",&this->ScaleY,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"alpha",&this->Alpha,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"alphacolor",&this->AlphaColor,(uint32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"translation",&this->Translation,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"picnum",&this->PicNum,(FTextureID *)0x0);
  pFVar1 = ::Serialize(pFVar1,"renderflags",&this->RenderFlags,(uint32_t *)0x0);
  pFVar1 = FSerializer::Array<unsigned_char>
                     (pFVar1,"renderstyle",(uchar *)&(this->RenderStyle).AsDWORD,(uchar *)0x0,4,
                      false);
  pFVar1 = Serialize<side_t>(pFVar1,"side",&this->Side,(side_t **)0x0);
  Serialize<sector_t>(pFVar1,"sector",&this->Sector,(sector_t_conflict **)0x0);
  return;
}

Assistant:

void DBaseDecal::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("wallprev", WallPrev)
		("wallnext", WallNext)
		("leftdistance", LeftDistance)
		("z", Z)
		("scalex", ScaleX)
		("scaley", ScaleY)
		("alpha", Alpha)
		("alphacolor", AlphaColor)
		("translation", Translation)
		("picnum", PicNum)
		("renderflags", RenderFlags)
		("renderstyle", RenderStyle)
		("side", Side)
		("sector", Sector);
}